

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTDMT_jobDescription * ZSTDMT_createJobsTable(U32 *nbJobsPtr,ZSTD_customMem cMem)

{
  U32 UVar1;
  uint uVar2;
  uint uVar3;
  uint nbJobs_00;
  uint local_4c;
  int initError;
  ZSTDMT_jobDescription *jobTable;
  U32 jobNb;
  U32 nbJobs;
  U32 nbJobsLog2;
  U32 *nbJobsPtr_local;
  
  UVar1 = ZSTD_highbit32(*nbJobsPtr);
  nbJobs_00 = 1 << ((char)UVar1 + 1U & 0x1f);
  nbJobsPtr_local = (U32 *)ZSTD_calloc((ulong)nbJobs_00 * 0x178,cMem);
  local_4c = 0;
  if ((ZSTDMT_jobDescription *)nbJobsPtr_local == (ZSTDMT_jobDescription *)0x0) {
    nbJobsPtr_local = (U32 *)0x0;
  }
  else {
    *nbJobsPtr = nbJobs_00;
    for (jobTable._4_4_ = 0; jobTable._4_4_ < nbJobs_00; jobTable._4_4_ = jobTable._4_4_ + 1) {
      uVar2 = pthread_mutex_init((pthread_mutex_t *)
                                 &((ZSTDMT_jobDescription *)
                                  ((long)nbJobsPtr_local + (ulong)jobTable._4_4_ * 0x178))->
                                  job_mutex,(pthread_mutexattr_t *)0x0);
      uVar3 = pthread_cond_init((pthread_cond_t *)
                                &((ZSTDMT_jobDescription *)
                                 ((long)nbJobsPtr_local + (ulong)jobTable._4_4_ * 0x178))->job_cond,
                                (pthread_condattr_t *)0x0);
      local_4c = uVar3 | uVar2 | local_4c;
    }
    if (local_4c != 0) {
      ZSTDMT_freeJobsTable((ZSTDMT_jobDescription *)nbJobsPtr_local,nbJobs_00,cMem);
      nbJobsPtr_local = (U32 *)0x0;
    }
  }
  return (ZSTDMT_jobDescription *)nbJobsPtr_local;
}

Assistant:

static ZSTDMT_jobDescription* ZSTDMT_createJobsTable(U32* nbJobsPtr, ZSTD_customMem cMem)
{
    U32 const nbJobsLog2 = ZSTD_highbit32(*nbJobsPtr) + 1;
    U32 const nbJobs = 1 << nbJobsLog2;
    U32 jobNb;
    ZSTDMT_jobDescription* const jobTable = (ZSTDMT_jobDescription*)
                ZSTD_calloc(nbJobs * sizeof(ZSTDMT_jobDescription), cMem);
    int initError = 0;
    if (jobTable==NULL) return NULL;
    *nbJobsPtr = nbJobs;
    for (jobNb=0; jobNb<nbJobs; jobNb++) {
        initError |= ZSTD_pthread_mutex_init(&jobTable[jobNb].job_mutex, NULL);
        initError |= ZSTD_pthread_cond_init(&jobTable[jobNb].job_cond, NULL);
    }
    if (initError != 0) {
        ZSTDMT_freeJobsTable(jobTable, nbJobs, cMem);
        return NULL;
    }
    return jobTable;
}